

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Bitmask sqlite3WhereGetMask(WhereMaskSet *pMaskSet,int iCursor)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (pMaskSet->ix[0] == iCursor) {
    return 1;
  }
  lVar3 = 0;
  do {
    lVar1 = lVar3 + 1;
    if (pMaskSet->n <= lVar1) {
      return 0;
    }
    lVar2 = lVar3 + 1;
    lVar3 = lVar1;
  } while (pMaskSet->ix[lVar2] != iCursor);
  return 1L << ((byte)lVar1 & 0x3f);
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3WhereGetMask(WhereMaskSet *pMaskSet, int iCursor){
  int i;
  assert( pMaskSet->n<=(int)sizeof(Bitmask)*8 );
  assert( pMaskSet->n>0 || pMaskSet->ix[0]<0 );
  assert( iCursor>=-1 );
  if( pMaskSet->ix[0]==iCursor ){
    return 1;
  }
  for(i=1; i<pMaskSet->n; i++){
    if( pMaskSet->ix[i]==iCursor ){
      return MASKBIT(i);
    }
  }
  return 0;
}